

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimulationFactoredDecPOMDPDiscrete.cpp
# Opt level: O0

double __thiscall
SimulationFactoredDecPOMDPDiscrete::RunSimulation
          (SimulationFactoredDecPOMDPDiscrete *this,JointPolicyDiscrete *jp)

{
  ulong uVar1;
  bool bVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar3;
  FactoredDecPOMDPDiscreteInterface *pFVar4;
  ostream *poVar5;
  reference pvVar6;
  undefined8 in_RSI;
  Simulation *in_RDI;
  SimulationFactoredDecPOMDPDiscrete *unaff_retaddr;
  double *in_stack_00000010;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_00000068;
  Index i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> oIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> aIs;
  vector<unsigned_int,_std::allocator<unsigned_int>_> ohIs;
  double sumR;
  double r;
  uint t;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sIs;
  size_t nrAgents;
  allocator_type *in_stack_fffffffffffffe88;
  double dVar7;
  allocator_type *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  value_type in_stack_fffffffffffffea0;
  Index in_stack_fffffffffffffea4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *indivDomIndices;
  JointPolicyDiscrete *this_00;
  Interface_ProblemToPolicyDiscrete **ppIVar8;
  PlanningUnitMADPDiscrete *in_stack_fffffffffffffec8;
  uint local_dc;
  JointPolicyDiscrete local_d5;
  string local_98 [36];
  undefined4 local_74;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_70;
  double local_58;
  uint local_48;
  double in_stack_ffffffffffffffd0;
  double *in_stack_ffffffffffffffd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffffe0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *sIs_00;
  Simulation *aIs_00;
  
  aIs_00 = in_RDI;
  pvVar3 = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
           (**(code **)(**(long **)&in_RDI[3]._m_nrRuns + 0x30))();
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8f8e91);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),in_stack_fffffffffffffe90
            );
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8f8ebd);
  local_58 = 0.0;
  local_74 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8f8ef9);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (value_type_conflict1 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8f8f2d);
  pFVar4 = PlanningUnitFactoredDecPOMDPDiscrete::GetFDPOMDPD
                     (*(PlanningUnitFactoredDecPOMDPDiscrete **)&in_RDI[3]._m_nrRuns);
  (**(code **)(*(long *)(&pFVar4->field_0x0 + *(long *)(*(long *)pFVar4 + -0xf8)) + 0x1f0))
            (&pFVar4->field_0x0 + *(long *)(*(long *)pFVar4 + -0xf8),&stack0xffffffffffffffd0);
  bVar2 = Simulation::GetVerbose(in_RDI);
  if (bVar2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"Simulation::RunSimulation ");
    poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<(poVar5,"Simulation::RunSimulation set initial state to ");
    PrintTools::SoftPrintVector<unsigned_int>(in_stack_00000068);
    in_stack_fffffffffffffec8 = (PlanningUnitMADPDiscrete *)std::operator<<(poVar5,local_98);
    std::ostream::operator<<(in_stack_fffffffffffffec8,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string(local_98);
  }
  local_d5._m_PTPD._1_4_ = 0x7fffffff;
  ppIVar8 = &local_d5._m_PTPD;
  indivDomIndices = pvVar3;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8f90e5);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (value_type_conflict1 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8f9113);
  local_d5.super_JointPolicy._vptr_JointPolicy._1_4_ = 0x7fffffff;
  this_00 = &local_d5;
  sIs_00 = indivDomIndices;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x8f913d);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
             (value_type_conflict1 *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x8f916b);
  for (local_48 = 0; uVar1._0_4_ = in_RDI[1]._m_nrRuns, uVar1._4_4_ = in_RDI[1]._m_random_seed,
      local_48 < uVar1; local_48 = local_48 + 1) {
    JointPolicyDiscrete::SampleJointActionVector
              (this_00,indivDomIndices,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0));
    Step(unaff_retaddr,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)aIs_00,
         (uint)((ulong)in_RSI >> 0x20),sIs_00,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
         in_stack_00000010,in_stack_ffffffffffffffd0);
    if ((ulong)local_48 < *(long *)&in_RDI[1]._m_nrRuns - 1U) {
      for (local_dc = 0;
          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)local_dc != sIs_00;
          local_dc = local_dc + 1) {
        in_stack_fffffffffffffe90 = *(allocator_type **)&in_RDI[3]._m_nrRuns;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_70,(ulong)local_dc);
        in_stack_fffffffffffffea0 = *pvVar6;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   ((long)&local_d5.super_JointPolicy._vptr_JointPolicy + 5),(ulong)local_dc);
        in_stack_fffffffffffffea4 =
             PlanningUnitMADPDiscrete::GetSuccessorOHI
                       (in_stack_fffffffffffffec8,(Index)((ulong)ppIVar8 >> 0x20),(Index)ppIVar8,
                        (Index)((ulong)pvVar3 >> 0x20));
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (&local_70,(ulong)local_dc);
        *pvVar6 = in_stack_fffffffffffffea4;
      }
    }
  }
  dVar7 = local_58;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe90);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe90);
  return dVar7;
}

Assistant:

double
SimulationFactoredDecPOMDPDiscrete::RunSimulation(const JointPolicyDiscrete *jp) const
{
    size_t nrAgents=_m_puFactored->GetNrAgents();
    std::vector<Index> sIs(nrAgents);
    unsigned int t;
    double r,sumR=0;

    vector<Index> ohIs(nrAgents,0); // INITIAL_OHI does not exist
    
    _m_puFactored->GetFDPOMDPD()->SampleInitialState(sIs);

    if(GetVerbose())
        cout << "Simulation::RunSimulation " << endl
             << "Simulation::RunSimulation set initial state to " 
             << SoftPrintVector(sIs) << endl;

    vector<Index> aIs(nrAgents,INT_MAX),
        oIs(nrAgents,INT_MAX);

    for(t=0;t<_m_horizon;t++)
    {	
        jp->SampleJointActionVector(ohIs,aIs);

        Step(aIs, t, sIs, oIs, r, sumR, 0);
        
        /* action taken at ts=0,...,hor-1 - therefore only observation
         * histories at ts=0,...,hor-2 have successors.*/
        if(t < _m_horizon-1) 
        {
            for(Index i=0;i!=nrAgents;++i)
                ohIs[i] = _m_puFactored->GetSuccessorOHI(i, ohIs[i], oIs[i]);
        }
    }

    return(sumR);
}